

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structure.cpp
# Opt level: O2

void __thiscall polyscope::Structure::setTransformUniforms(Structure *this,ShaderProgram *p)

{
  SlicePlane *this_00;
  undefined8 *puVar1;
  bool bVar2;
  int iVar3;
  string *this_01;
  undefined8 *puVar4;
  vec4 vVar5;
  mat4 P;
  mat4 Pinv;
  mat4 projMat;
  mat4 viewMat;
  allocator local_359;
  Structure *local_358;
  undefined8 local_348;
  mat<4,_4,_float,_(glm::qualifier)0> local_330;
  string local_2f0 [32];
  string local_2d0 [32];
  string local_2b0 [32];
  string local_290 [32];
  string local_270 [32];
  string local_250 [32];
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  mat<4,_4,_float,_(glm::qualifier)0> local_110;
  string local_d0;
  allocator local_b0 [64];
  mat4 local_70;
  
  local_358 = this;
  getModelView(&local_70,this);
  std::__cxx11::string::string(local_130,"u_modelView",local_b0);
  (*p->_vptr_ShaderProgram[7])(p,local_130,&local_70);
  std::__cxx11::string::~string(local_130);
  view::getCameraPerspectiveMatrix();
  std::__cxx11::string::string(local_150,"u_projMatrix",(allocator *)&local_330);
  (*p->_vptr_ShaderProgram[7])(p,local_150,local_b0);
  std::__cxx11::string::~string(local_150);
  bVar2 = render::Engine::transparencyEnabled(render::engine);
  if (bVar2) {
    std::__cxx11::string::string(local_170,"u_transparency",(allocator *)&local_330);
    iVar3 = (*p->_vptr_ShaderProgram[2])(p,local_170);
    std::__cxx11::string::~string(local_170);
    if ((char)iVar3 != '\0') {
      std::__cxx11::string::string(local_190,"u_transparency",(allocator *)&local_330);
      (*p->_vptr_ShaderProgram[5])((ulong)(uint)(local_358->transparency).value,p,local_190);
      std::__cxx11::string::~string(local_190);
    }
    std::__cxx11::string::string(local_1b0,"u_viewportDim",(allocator *)&local_330);
    iVar3 = (*p->_vptr_ShaderProgram[2])(p,local_1b0);
    std::__cxx11::string::~string(local_1b0);
    if ((char)iVar3 != '\0') {
      vVar5 = render::Engine::getCurrentViewport(render::engine);
      local_348 = vVar5._8_8_;
      std::__cxx11::string::string(local_1d0,"u_viewportDim",(allocator *)&local_330);
      (*p->_vptr_ShaderProgram[8])(local_348,p,local_1d0);
      std::__cxx11::string::~string(local_1d0);
    }
    bVar2 = render::Engine::transparencyEnabled(render::engine);
    if (bVar2) {
      std::__cxx11::string::string(local_2f0,"t_minDepth",(allocator *)&local_330);
      iVar3 = (*p->_vptr_ShaderProgram[0x15])(p,local_2f0);
      if ((char)iVar3 == '\0') {
        this_01 = local_2f0;
      }
      else {
        std::__cxx11::string::string(local_1f0,"t_minDepth",(allocator *)&local_110);
        iVar3 = (*p->_vptr_ShaderProgram[0x16])(p,local_1f0);
        std::__cxx11::string::~string(local_1f0);
        std::__cxx11::string::~string(local_2f0);
        if ((char)iVar3 != '\0') goto LAB_001a2b8a;
        std::__cxx11::string::string(local_210,"t_minDepth",(allocator *)&local_330);
        (*p->_vptr_ShaderProgram[0x1a])
                  (p,local_210,
                   (render::engine->sceneDepthMin).
                   super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        this_01 = local_210;
      }
      std::__cxx11::string::~string(this_01);
    }
  }
LAB_001a2b8a:
  puVar1 = DAT_00480e78;
  for (puVar4 = state::slicePlanes; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    this_00 = (SlicePlane *)*puVar4;
    std::__cxx11::string::string((string *)&local_d0,(string *)this_00);
    bVar2 = getIgnoreSlicePlane(local_358,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    SlicePlane::setSceneObjectUniforms(this_00,p,bVar2);
  }
  std::__cxx11::string::string(local_230,"u_viewport_worldPos",(allocator *)&local_330);
  iVar3 = (*p->_vptr_ShaderProgram[2])(p,local_230);
  std::__cxx11::string::~string(local_230);
  if ((char)iVar3 != '\0') {
    vVar5 = render::Engine::getCurrentViewport(render::engine);
    local_348 = vVar5._8_8_;
    local_358 = vVar5._0_8_;
    std::__cxx11::string::string(local_250,"u_viewport_worldPos",(allocator *)&local_330);
    (*p->_vptr_ShaderProgram[10])(local_358,local_348,p,local_250);
    std::__cxx11::string::~string(local_250);
  }
  std::__cxx11::string::string(local_270,"u_invProjMatrix_worldPos",(allocator *)&local_330);
  iVar3 = (*p->_vptr_ShaderProgram[2])(p,local_270);
  std::__cxx11::string::~string(local_270);
  if ((char)iVar3 != '\0') {
    view::getCameraPerspectiveMatrix();
    glm::detail::compute_inverse<4,_4,_float,_(glm::qualifier)0,_false>::call(&local_110,&local_330)
    ;
    std::__cxx11::string::string(local_290,"u_invProjMatrix_worldPos",&local_359);
    (*p->_vptr_ShaderProgram[7])(p,local_290,&local_110);
    std::__cxx11::string::~string(local_290);
  }
  std::__cxx11::string::string(local_2b0,"u_invViewMatrix_worldPos",(allocator *)&local_330);
  iVar3 = (*p->_vptr_ShaderProgram[2])(p,local_2b0);
  std::__cxx11::string::~string(local_2b0);
  if ((char)iVar3 != '\0') {
    view::getCameraViewMatrix();
    glm::detail::compute_inverse<4,_4,_float,_(glm::qualifier)0,_false>::call(&local_110,&local_330)
    ;
    std::__cxx11::string::string(local_2d0,"u_invViewMatrix_worldPos",&local_359);
    (*p->_vptr_ShaderProgram[7])(p,local_2d0,&local_110);
    std::__cxx11::string::~string(local_2d0);
  }
  return;
}

Assistant:

void Structure::setTransformUniforms(render::ShaderProgram& p) {
  glm::mat4 viewMat = getModelView();
  p.setUniform("u_modelView", glm::value_ptr(viewMat));

  glm::mat4 projMat = view::getCameraPerspectiveMatrix();
  p.setUniform("u_projMatrix", glm::value_ptr(projMat));

  if (render::engine->transparencyEnabled()) {
    if (p.hasUniform("u_transparency")) {
      p.setUniform("u_transparency", transparency.get());
    }

    if (p.hasUniform("u_viewportDim")) {
      glm::vec4 viewport = render::engine->getCurrentViewport();
      glm::vec2 viewportDim{viewport[2], viewport[3]};
      p.setUniform("u_viewportDim", viewportDim);
    }

    // Attach the min depth texture, if needed
    // (note that this design is somewhat lazy wrt to the name of the function: it sets a texture, not a uniform, and
    // only actually does anything once on initialization)
    if (render::engine->transparencyEnabled() && p.hasTexture("t_minDepth") && !p.textureIsSet("t_minDepth")) {
      p.setTextureFromBuffer("t_minDepth", render::engine->sceneDepthMin.get());
    }
  }

  // Respect any slice planes
  for (SlicePlane* s : state::slicePlanes) {
    bool ignoreThisPlane = getIgnoreSlicePlane(s->name);
    s->setSceneObjectUniforms(p, ignoreThisPlane);
  }

  // TODO this chain if "if"s is not great. Set up some system in the render engine to conditionally set these? Maybe
  // a list of lambdas? Ugh.
  if (p.hasUniform("u_viewport_worldPos")) {
    glm::vec4 viewport = render::engine->getCurrentViewport();
    p.setUniform("u_viewport_worldPos", viewport);
  }
  if (p.hasUniform("u_invProjMatrix_worldPos")) {
    glm::mat4 P = view::getCameraPerspectiveMatrix();
    glm::mat4 Pinv = glm::inverse(P);
    p.setUniform("u_invProjMatrix_worldPos", glm::value_ptr(Pinv));
  }
  if (p.hasUniform("u_invViewMatrix_worldPos")) {
    glm::mat4 V = view::getCameraViewMatrix();
    glm::mat4 Vinv = glm::inverse(V);
    p.setUniform("u_invViewMatrix_worldPos", glm::value_ptr(Vinv));
  }
}